

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::MapFieldGenerator::MapFieldGenerator
          (MapFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  ObjectiveCType OVar1;
  ObjectiveCType OVar2;
  Descriptor *pDVar3;
  FieldDescriptor *this_02;
  FieldDescriptor *field;
  FieldGenerator *pFVar4;
  mapped_type *pmVar5;
  long lVar6;
  FieldDescriptor *field_00;
  string *this_03;
  string class_name;
  string local_110;
  allocator<char> local_e9;
  key_type local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  field_flags;
  string local_b0;
  key_type local_90;
  string local_70;
  key_type local_50;
  
  RepeatedFieldGenerator::RepeatedFieldGenerator
            (&this->super_RepeatedFieldGenerator,descriptor,options);
  (this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.super_SingleFieldGenerator.
  super_FieldGenerator._vptr_FieldGenerator = (_func_int **)&PTR__MapFieldGenerator_00429eb0;
  this_00 = &this->value_field_generator_;
  (this->value_field_generator_).ptr_ = (FieldGenerator *)0x0;
  pDVar3 = FieldDescriptor::message_type(descriptor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"key",(allocator<char> *)&class_name);
  this_02 = Descriptor::FindFieldByName(pDVar3,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  pDVar3 = FieldDescriptor::message_type(descriptor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"value",(allocator<char> *)&class_name);
  field = Descriptor::FindFieldByName(pDVar3,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  pFVar4 = FieldGenerator::Make(field,options);
  internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::reset
            (this_00,pFVar4);
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (this_00);
  FieldGenerator::variable_abi_cxx11_(&local_110,pFVar4,"field_type");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&class_name,"field_type",(allocator<char> *)&local_e8);
  this_01 = &(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
             super_SingleFieldGenerator.super_FieldGenerator.variables_;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&class_name);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_110);
  std::__cxx11::string::~string((string *)&class_name);
  std::__cxx11::string::~string((string *)&local_110);
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (this_00);
  FieldGenerator::variable_abi_cxx11_(&local_110,pFVar4,"default");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&class_name,"default",(allocator<char> *)&local_e8);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&class_name);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_110);
  std::__cxx11::string::~string((string *)&class_name);
  std::__cxx11::string::~string((string *)&local_110);
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (this_00);
  FieldGenerator::variable_abi_cxx11_(&local_110,pFVar4,"default_name");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&class_name,"default_name",(allocator<char> *)&local_e8);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&class_name);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_110);
  std::__cxx11::string::~string((string *)&class_name);
  std::__cxx11::string::~string((string *)&local_110);
  field_flags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  field_flags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  field_flags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetCapitalizedType_abi_cxx11_(&class_name,(objectivec *)this_02,field_00);
  std::operator+(&local_110,"GPBFieldMapKey",&class_name);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&field_flags,
             &local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&class_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"fieldflags",(allocator<char> *)&class_name);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_110);
  lVar6 = std::__cxx11::string::find((char *)pmVar5,0x36abeb);
  std::__cxx11::string::~string((string *)&local_110);
  if (lVar6 != -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"GPBFieldTextFormatNameCustom",(allocator<char> *)&class_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&field_flags,
               &local_110);
    std::__cxx11::string::~string((string *)&local_110);
  }
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (this_00);
  FieldGenerator::variable_abi_cxx11_(&local_110,pFVar4,"fieldflags");
  lVar6 = std::__cxx11::string::find((char *)&local_110,0x3910a4);
  if (lVar6 != -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&class_name,"GPBFieldHasDefaultValue",(allocator<char> *)&local_e8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&field_flags,
               &class_name);
    std::__cxx11::string::~string((string *)&class_name);
  }
  lVar6 = std::__cxx11::string::find((char *)&local_110,0x3910bc);
  if (lVar6 != -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&class_name,"GPBFieldHasEnumDescriptor",(allocator<char> *)&local_e8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&field_flags,
               &class_name);
    std::__cxx11::string::~string((string *)&class_name);
  }
  BuildFlagsString(&class_name,FLAGTYPE_FIELD,&field_flags);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"fieldflags",(allocator<char> *)&local_b0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_e8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&class_name);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&class_name);
  OVar1 = GetObjectiveCType(field);
  OVar2 = GetObjectiveCType(this_02);
  if (((OVar2 == OBJECTIVECTYPE_STRING) && (OVar1 < (OBJECTIVECTYPE_MESSAGE|OBJECTIVECTYPE_UINT32)))
     && ((0x580U >> (OVar1 & 0x1f) & 1) != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&class_name,"array_storage_type",(allocator<char> *)&local_e8);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_01,&class_name);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&class_name);
    pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::
             operator->(this_00);
    FieldGenerator::variable_abi_cxx11_(&local_b0,pFVar4,"storage_type");
    std::operator+(&local_e8,"NSMutableDictionary<NSString*, ",&local_b0);
    std::operator+(&class_name,&local_e8,"*>");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"array_property_type",(allocator<char> *)&local_70);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_01,&local_90);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&class_name);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&class_name);
    std::__cxx11::string::~string((string *)&local_e8);
    this_03 = &local_b0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&class_name,"GPB",(allocator<char> *)&local_e8);
    anon_unknown_9::MapEntryTypeName(this_02,true);
    std::__cxx11::string::append((char *)&class_name);
    anon_unknown_9::MapEntryTypeName(field,false);
    std::__cxx11::string::append((char *)&class_name);
    std::__cxx11::string::append((char *)&class_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"array_storage_type",(allocator<char> *)&local_b0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_01,&local_e8);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&local_e8);
    if ((OVar1 < (OBJECTIVECTYPE_MESSAGE|OBJECTIVECTYPE_UINT32)) &&
       ((0x580U >> (OVar1 & 0x1f) & 1) != 0)) {
      std::operator+(&local_90,&class_name,"<");
      pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::
               operator->(this_00);
      FieldGenerator::variable_abi_cxx11_(&local_70,pFVar4,"storage_type");
      std::operator+(&local_b0,&local_90,&local_70);
      std::operator+(&local_e8,&local_b0,"*>");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"array_property_type",&local_e9);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_01,&local_50);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
    this_03 = &class_name;
  }
  std::__cxx11::string::~string((string *)this_03);
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (this_00);
  FieldGenerator::variable_abi_cxx11_(&class_name,pFVar4,"dataTypeSpecific_name");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"dataTypeSpecific_name",(allocator<char> *)&local_b0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_e8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&class_name);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&class_name);
  pFVar4 = internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->
                     (this_00);
  FieldGenerator::variable_abi_cxx11_(&class_name,pFVar4,"dataTypeSpecific_value");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"dataTypeSpecific_value",(allocator<char> *)&local_b0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_e8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&class_name);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&class_name);
  std::__cxx11::string::~string((string *)&local_110);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&field_flags);
  return;
}

Assistant:

MapFieldGenerator::MapFieldGenerator(const FieldDescriptor* descriptor,
                                     const Options& options)
    : RepeatedFieldGenerator(descriptor, options) {
  const FieldDescriptor* key_descriptor =
      descriptor->message_type()->FindFieldByName("key");
  const FieldDescriptor* value_descriptor =
      descriptor->message_type()->FindFieldByName("value");
  value_field_generator_.reset(FieldGenerator::Make(value_descriptor, options));

  // Pull over some variables_ from the value.
  variables_["field_type"] = value_field_generator_->variable("field_type");
  variables_["default"] = value_field_generator_->variable("default");
  variables_["default_name"] = value_field_generator_->variable("default_name");

  // Build custom field flags.
  std::vector<string> field_flags;
  field_flags.push_back("GPBFieldMapKey" + GetCapitalizedType(key_descriptor));
  // Pull over the current text format custom name values that was calculated.
  if (variables_["fieldflags"].find("GPBFieldTextFormatNameCustom") !=
      string::npos) {
    field_flags.push_back("GPBFieldTextFormatNameCustom");
  }
  // Pull over some info from the value's flags.
  const string& value_field_flags =
      value_field_generator_->variable("fieldflags");
  if (value_field_flags.find("GPBFieldHasDefaultValue") != string::npos) {
    field_flags.push_back("GPBFieldHasDefaultValue");
  }
  if (value_field_flags.find("GPBFieldHasEnumDescriptor") != string::npos) {
    field_flags.push_back("GPBFieldHasEnumDescriptor");
  }
  variables_["fieldflags"] = BuildFlagsString(FLAGTYPE_FIELD, field_flags);

  ObjectiveCType value_objc_type = GetObjectiveCType(value_descriptor);
  const bool value_is_object_type =
      ((value_objc_type == OBJECTIVECTYPE_STRING) ||
       (value_objc_type == OBJECTIVECTYPE_DATA) ||
       (value_objc_type == OBJECTIVECTYPE_MESSAGE));
  if ((GetObjectiveCType(key_descriptor) == OBJECTIVECTYPE_STRING) &&
      value_is_object_type) {
    variables_["array_storage_type"] = "NSMutableDictionary";
    variables_["array_property_type"] =
        "NSMutableDictionary<NSString*, " +
        value_field_generator_->variable("storage_type") + "*>";
  } else {
    string class_name("GPB");
    class_name += MapEntryTypeName(key_descriptor, true);
    class_name += MapEntryTypeName(value_descriptor, false);
    class_name += "Dictionary";
    variables_["array_storage_type"] = class_name;
    if (value_is_object_type) {
      variables_["array_property_type"] =
          class_name + "<" +
          value_field_generator_->variable("storage_type") + "*>";
    }
  }

  variables_["dataTypeSpecific_name"] =
      value_field_generator_->variable("dataTypeSpecific_name");
  variables_["dataTypeSpecific_value"] =
      value_field_generator_->variable("dataTypeSpecific_value");
}